

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::MergePartialFromCodedStream
          (BayesianProbitRegressor_FeatureValueWeight *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  short extraout_AX;
  uint32 uVar4;
  uint uVar5;
  undefined8 in_RAX;
  BayesianProbitRegressor_Gaussian *this_00;
  ulong extraout_RAX;
  uint tag;
  ulong uVar6;
  int local_34;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_002aaade;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_002aaade:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar6 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar4 | uVar6;
    }
    tag = (uint)uVar6;
    if ((uVar6 & 0x100000000) == 0) {
LAB_002aab39:
      local_34 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
        if (bVar3) goto LAB_002aab60;
        local_34 = 6;
      }
    }
    else {
      uVar5 = (uint)(uVar6 >> 3) & 0x1fffffff;
      if (uVar5 == 2) {
        if ((char)uVar6 != '\x12') goto LAB_002aab39;
        if (this->featureweight_ == (BayesianProbitRegressor_Gaussian *)0x0) {
          this_00 = (BayesianProbitRegressor_Gaussian *)operator_new(0x28);
          BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(this_00);
          this->featureweight_ = this_00;
        }
        MergePartialFromCodedStream();
        if ((extraout_RAX & 1) == 0) goto LAB_002aab60;
        local_34 = (int)((ulong)in_RAX >> 0x20);
      }
      else {
        if ((uVar5 != 1) || (MergePartialFromCodedStream(), extraout_AX == 0)) goto LAB_002aab39;
        local_34 = 6;
        if (extraout_AX != 1) goto LAB_002aab62;
LAB_002aab60:
        local_34 = 0;
      }
    }
LAB_002aab62:
    if (local_34 != 0) {
      return local_34 != 6;
    }
  } while( true );
}

Assistant:

bool BayesianProbitRegressor_FeatureValueWeight::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 featureValue = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &featurevalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BayesianProbitRegressor.Gaussian featureWeight = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_featureweight()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  return false;
#undef DO_
}